

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_trace_file_base.cpp
# Opt level: O2

bool __thiscall sc_core::sc_trace_file_base::add_trace_check(sc_trace_file_base *this,string *name)

{
  bool bVar1;
  ostream *poVar2;
  char *local_1c0;
  stringstream ss;
  ostream local_190 [376];
  
  bVar1 = this->initialized_;
  if (bVar1 == true) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar2 = std::operator<<(local_190,"sc_trace() failed:\n\tNo traces can be added to \'");
    poVar2 = std::operator<<(poVar2,(string *)&this->filename_);
    poVar2 = std::operator<<(poVar2,"\' once trace recording has started.\n\tTo add tracing of \'");
    poVar2 = std::operator<<(poVar2,(string *)name);
    std::operator<<(poVar2,"\', create a new trace file.");
    std::__cxx11::stringbuf::str();
    sc_report_handler::report
              (SC_ERROR,"sc_trace_file already initialized",local_1c0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/tracing/sc_trace_file_base.cpp"
               ,0xf0);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  return (bool)(bVar1 ^ 1);
}

Assistant:

bool
sc_trace_file_base::add_trace_check( const std::string & name ) const
{
    if( !initialized_ ) return true;

    std::stringstream ss;
    ss << "sc_trace() failed:\n"
         "\tNo traces can be added to "
         "'" << filename_  << "'"
         " once trace recording has started.\n"
         "\tTo add tracing of '" << name << "', create a new trace file.";

    SC_REPORT_ERROR( SC_ID_TRACING_ALREADY_INITIALIZED_
                   , ss.str().c_str() );
    return false;
}